

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<DomResource_*>::relocate
          (QArrayDataPointer<DomResource_*> *this,qsizetype offset,DomResource ***data)

{
  DomResource **d_first;
  DomResource **ppDVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<DomResource*,long_long>(this->ptr,this->size,d_first);
  if (data != (DomResource ***)0x0) {
    ppDVar1 = *data;
    if ((this->ptr <= ppDVar1) && (ppDVar1 < this->ptr + this->size)) {
      *data = ppDVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }